

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RangeSink::AddFileRangeForFileRange
          (RangeSink *this,char *analyzer,string_view from_file_range,string_view file_range)

{
  string_view format;
  bool bVar1;
  undefined1 uVar2;
  const_pointer pvVar3;
  const_pointer pvVar4;
  RangeMap *other;
  reference ppVar5;
  undefined8 uVar6;
  size_type sVar7;
  string *in_RSI;
  undefined8 *in_RDI;
  bool ok;
  string label;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *pair;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  *__range1;
  bool verbose;
  uint64_t from_file_offset;
  uint64_t file_offset;
  DualMap *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  DataSource in_stack_fffffffffffffdf4;
  Arg *in_stack_fffffffffffffdf8;
  Arg *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe18;
  Arg *a1;
  Arg *a0;
  string *this_00;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  RangeMap *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  Arg *in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe58;
  RangeMap *in_stack_fffffffffffffe60;
  Arg local_178 [3];
  string local_d8 [35];
  undefined1 local_b5;
  string local_a8 [16];
  uint64_t in_stack_ffffffffffffff68;
  uint64_t in_stack_ffffffffffffff70;
  RangeSink *in_stack_ffffffffffffff78;
  __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
  local_78;
  undefined8 *local_70;
  undefined1 local_61;
  string_view local_60;
  Arg *local_50;
  string_view local_48;
  RangeMap *local_38;
  string *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_30 = in_RSI;
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
  local_48 = InputFile::data((InputFile *)*in_RDI);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_48);
  local_38 = (RangeMap *)(pvVar3 + -(long)pvVar4);
  other = (RangeMap *)std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  local_60 = InputFile::data((InputFile *)*in_RDI);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_60);
  local_50 = (Arg *)((long)other - (long)pvVar3);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
  local_61 = IsVerboseForFileRange
                       (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff68);
  if ((bool)local_61) {
    in_stack_fffffffffffffe40 = (RangeMap *)GetDataSourceLabel(in_stack_fffffffffffffdf4);
    in_stack_fffffffffffffe50 = local_50;
    in_stack_fffffffffffffe58 =
         std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    in_stack_fffffffffffffe60 = local_38;
    in_stack_fffffffffffffde8 =
         (DualMap *)std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
    printf("[%s, %s] AddFileRangeForFileRange([%lx, %zx], [%lx, %zx])\n",in_stack_fffffffffffffe40,
           local_30,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58,in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe48 = local_30;
  }
  if (in_RDI[0x1e] == 0) {
    __assert_fail("translator_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x4d4,
                  "void bloaty::RangeSink::AddFileRangeForFileRange(const char *, std::string_view, std::string_view)"
                 );
  }
  local_70 = in_RDI + 0x1f;
  local_78._M_current =
       (pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *)
       std::
       vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
       ::begin((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                *)in_stack_fffffffffffffde8);
  std::
  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  ::end((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
         *)in_stack_fffffffffffffde8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                             *)in_stack_fffffffffffffde8), bVar1) {
    ppVar5 = __gnu_cxx::
             __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
             ::operator*(&local_78);
    this_00 = local_a8;
    std::__cxx11::string::string(this_00);
    a1 = (Arg *)&ppVar5->first->file_map;
    a0 = local_50;
    std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    in_stack_fffffffffffffe3f =
         RangeMap::TryGetLabelForRange
                   ((RangeMap *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                    (uint64_t)this_00,(uint64_t)a0,(string *)a1);
    if ((bool)in_stack_fffffffffffffe3f) {
      std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
      in_stack_fffffffffffffde8 = ppVar5->first;
      uVar2 = RangeMap::AddRangeWithTranslation
                        (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                         (uint64_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe40,(bool)in_stack_fffffffffffffe3f,other);
      local_b5 = uVar2;
      if ((!(bool)uVar2) && (0 < verbose_level)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&in_stack_fffffffffffffe00->piece_,(char *)in_stack_fffffffffffffdf8);
        absl::substitute_internal::Arg::Arg
                  (in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
        std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
        absl::substitute_internal::Arg::Arg
                  (in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
        in_stack_fffffffffffffe00 = local_178;
        absl::substitute_internal::Arg::Arg<std::allocator<char>>
                  ((Arg *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffde8);
        format._M_str._0_7_ = in_stack_fffffffffffffe38;
        format._M_len = (size_t)this_00;
        format._M_str._7_1_ = in_stack_fffffffffffffe3f;
        absl::Substitute_abi_cxx11_(format,a0,a1,(Arg *)CONCAT17(uVar2,in_stack_fffffffffffffe18));
        uVar6 = std::__cxx11::string::c_str();
        printf("WARNING: %s\n",uVar6);
        std::__cxx11::string::~string(local_d8);
      }
    }
    else if (1 < verbose_level) {
      in_stack_fffffffffffffdf8 = local_50;
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
      printf("No label found for file range [%lx, %zx]\n",in_stack_fffffffffffffdf8,sVar7);
    }
    std::__cxx11::string::~string(local_a8);
    __gnu_cxx::
    __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
    ::operator++(&local_78);
  }
  return;
}

Assistant:

void RangeSink::AddFileRangeForFileRange(const char* analyzer,
                                         std::string_view from_file_range,
                                         std::string_view file_range) {
  uint64_t file_offset = file_range.data() - file_->data().data();
  uint64_t from_file_offset = from_file_range.data() - file_->data().data();
  bool verbose = IsVerboseForFileRange(file_offset, file_range.size());
  if (verbose) {
    printf("[%s, %s] AddFileRangeForFileRange([%" PRIx64 ", %zx], [%" PRIx64
           ", %zx])\n",
           GetDataSourceLabel(data_source_), analyzer, from_file_offset,
           from_file_range.size(), file_offset, file_range.size());
  }
  assert(translator_);
  for (auto& pair : outputs_) {
    std::string label;
    if (pair.first->file_map.TryGetLabelForRange(
            from_file_offset, from_file_range.size(), &label)) {
      bool ok = pair.first->file_map.AddRangeWithTranslation(
          file_offset, file_range.size(), label, translator_->file_map, verbose,
          &pair.first->vm_map);
      if (!ok) {
        WARN("File range ($0, $1) for label $2 extends beyond base map",
             file_offset, file_range.size(), label);
      }
    } else if (verbose_level > 1) {
      printf("No label found for file range [%" PRIx64 ", %zx]\n",
             from_file_offset, from_file_range.size());
    }
  }
}